

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checker.cpp
# Opt level: O2

void __thiscall CaDiCaL::Checker::enlarge_vars(Checker *this,int64_t idx)

{
  long lVar1;
  ulong __n;
  void *__s;
  long lVar2;
  ulong uVar3;
  char *pcVar4;
  
  lVar1 = this->size_vars;
  __n = 2;
  if (lVar1 != 0) {
    __n = lVar1 * 2;
  }
  do {
    uVar3 = __n;
    __n = uVar3 * 2;
  } while ((long)uVar3 <= idx);
  __s = operator_new__(__n);
  memset(__s,0,__n);
  if (lVar1 == 0) {
    pcVar4 = this->vals;
    lVar2 = 0;
  }
  else {
    lVar2 = -lVar1;
    pcVar4 = this->vals;
    memcpy((char *)((long)__s + uVar3) + -lVar1,pcVar4 + -lVar1,lVar1 * 2);
  }
  this->vals = pcVar4 + lVar2;
  if (pcVar4 != (char *)0x0) {
    operator_delete__(pcVar4 + lVar2);
  }
  this->vals = (char *)((long)__s + uVar3);
  this->size_vars = uVar3;
  std::
  vector<std::vector<CaDiCaL::CheckerWatch,_std::allocator<CaDiCaL::CheckerWatch>_>,_std::allocator<std::vector<CaDiCaL::CheckerWatch,_std::allocator<CaDiCaL::CheckerWatch>_>_>_>
  ::resize(&this->watchers,__n);
  std::vector<signed_char,_std::allocator<signed_char>_>::resize(&this->marks,__n);
  return;
}

Assistant:

void Checker::enlarge_vars (int64_t idx) {

  assert (0 < idx), assert (idx <= INT_MAX);

  int64_t new_size_vars = size_vars ? 2 * size_vars : 2;
  while (idx >= new_size_vars)
    new_size_vars *= 2;
  LOG ("CHECKER enlarging variables of checker from %" PRId64 " to %" PRId64
       "",
       size_vars, new_size_vars);

  signed char *new_vals;
  new_vals = new signed char[2 * new_size_vars];
  clear_n (new_vals, 2 * new_size_vars);
  new_vals += new_size_vars;
  if (size_vars) // To make sanitizer happy (without '-O').
    memcpy ((void *) (new_vals - size_vars), (void *) (vals - size_vars),
            2 * size_vars);
  vals -= size_vars;
  delete[] vals;
  vals = new_vals;
  size_vars = new_size_vars;

  watchers.resize (2 * new_size_vars);
  marks.resize (2 * new_size_vars);

  assert (idx < new_size_vars);
}